

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void check_output(void *input_buffer,void *output_buffer,long frame_count)

{
  internal iVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  AssertHelper local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  AssertHelper local_30;
  void *local_28;
  
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = frame_count;
  local_28 = input_buffer;
  testing::internal::CmpHelperEQ<void_const*,decltype(nullptr)>
            ((internal *)local_58,"input_buffer","nullptr",&local_28,&local_70._M_head_impl);
  iVar1 = local_58[0];
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
               ,599,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (iVar1 != (internal)0x0) {
    local_70._M_head_impl._0_4_ = 0x100;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)local_58,"frame_count","256",&local_38,(int *)&local_70);
    iVar1 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
                 ,600,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (iVar1 != (internal)0x0) {
      local_70._M_head_impl._0_1_ = output_buffer != (void *)0x0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (output_buffer == (void *)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_70,(AssertionResult *)"!!output_buffer",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_resampler.cpp"
                   ,0x259,(char *)CONCAT71(local_58._1_7_,local_58[0]));
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1
                         );
        }
        if (local_60.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
  }
  return;
}

Assistant:

void
check_output(const void * input_buffer, void * output_buffer, long frame_count)
{
  ASSERT_EQ(input_buffer, nullptr);
  ASSERT_EQ(frame_count, 256);
  ASSERT_TRUE(!!output_buffer);
}